

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::CodedOutputStreamFieldSkipper::SkipUnknownEnum
          (CodedOutputStreamFieldSkipper *this,int field_number,int value)

{
  CodedOutputStream *pCVar1;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = (ulong)(uint)field_number;
  pCVar1 = this->unknown_fields_;
  pbVar3 = pCVar1->cur_;
  if ((pCVar1->impl_).end_ <= pbVar3) {
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&pCVar1->impl_,pbVar3);
  }
  if (0x7f < (uint)field_number) {
    do {
      uVar6 = (uint)uVar4;
      *pbVar3 = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      pbVar3 = pbVar3 + 1;
    } while (0x3fff < uVar6);
  }
  *pbVar3 = (byte)uVar4;
  pCVar1->cur_ = pbVar3 + 1;
  pCVar1 = this->unknown_fields_;
  pbVar3 = pCVar1->cur_;
  if ((pCVar1->impl_).end_ <= pbVar3) {
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&pCVar1->impl_,pbVar3);
  }
  uVar5 = (ulong)value;
  uVar4 = uVar5;
  if (0x7f < (uint)value) {
    do {
      *pbVar3 = (byte)uVar4 | 0x80;
      uVar5 = uVar4 >> 7;
      pbVar3 = pbVar3 + 1;
      bVar2 = 0x3fff < uVar4;
      uVar4 = uVar5;
    } while (bVar2);
  }
  *pbVar3 = (byte)uVar5;
  pCVar1->cur_ = pbVar3 + 1;
  return;
}

Assistant:

void CodedOutputStreamFieldSkipper::SkipUnknownEnum(int field_number,
                                                    int value) {
  unknown_fields_->WriteVarint32(field_number);
  unknown_fields_->WriteVarint64(value);
}